

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantFunction(Allocator *allocator,SynBase *source,VmFunction *function)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *this;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  this = (VmConstant *)CONCAT44(extraout_var,iVar1);
  VmConstant::VmConstant(this,allocator,(VmType)ZEXT816((ulong)0x400000005),source);
  this->fValue = function;
  return this;
}

Assistant:

VmConstant* CreateConstantFunction(Allocator *allocator, SynBase *source, VmFunction *function)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Function, source);

	result->fValue = function;

	return result;
}